

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O0

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QString *name)

{
  bool bVar1;
  QSslCipher *this_00;
  const_iterator o;
  QSslCipher *in_RDI;
  long in_FS_OFFSET;
  QSslCipher *cipher;
  QList<QSslCipher> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QSslCipher> ciphers;
  pointer in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  const_iterator local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCipher *)operator_new(0x98);
  QSslCipherPrivate::QSslCipherPrivate
            ((QSslCipherPrivate *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  std::unique_ptr<QSslCipherPrivate,std::default_delete<QSslCipherPrivate>>::
  unique_ptr<std::default_delete<QSslCipherPrivate>,void>
            ((unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSslConfiguration::supportedCiphers();
  local_28.i = (QSslCipher *)0xaaaaaaaaaaaaaaaa;
  local_28 = QList<QSslCipher>::begin
                       ((QList<QSslCipher> *)
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  o = QList<QSslCipher>::end
                ((QList<QSslCipher> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70))
  ;
  do {
    bVar1 = QList<QSslCipher>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) {
LAB_0038ba9e:
      QList<QSslCipher>::~QList((QList<QSslCipher> *)0x38baa8);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QSslCipher>::const_iterator::operator*(&local_28);
    QSslCipher::name(in_RDI);
    in_stack_ffffffffffffff77 =
         ::operator==((QString *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      (QString *)in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x38ba62);
    if ((in_stack_ffffffffffffff77 & 1) != 0) {
      operator=(this_00,in_RDI);
      goto LAB_0038ba9e;
    }
    QList<QSslCipher>::const_iterator::operator++(&local_28);
  } while( true );
}

Assistant:

QSslCipher::QSslCipher(const QString &name)
    : d(new QSslCipherPrivate)
{
    const auto ciphers = QSslConfiguration::supportedCiphers();
    for (const QSslCipher &cipher : ciphers) {
        if (cipher.name() == name) {
            *this = cipher;
            return;
        }
    }
}